

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O0

char * Abc_SopDecoderPos(Mem_Flex_t *pMan,int nValues)

{
  Vec_Str_t *p;
  char *pcVar1;
  int local_30;
  int local_2c;
  int k;
  int i;
  Vec_Str_t *vSop;
  char *pResult;
  int nValues_local;
  Mem_Flex_t *pMan_local;
  
  if (1 < nValues) {
    p = Vec_StrAlloc(100);
    for (local_2c = 0; local_2c < nValues; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < nValues; local_30 = local_30 + 1) {
        if (local_30 == local_2c) {
          Vec_StrPrintStr(p,"1 ");
        }
        else {
          Vec_StrPrintStr(p,"- ");
        }
      }
      Vec_StrPrintNum(p,local_2c);
      Vec_StrPush(p,'\n');
    }
    Vec_StrPush(p,'\0');
    pcVar1 = Vec_StrArray(p);
    pcVar1 = Abc_SopRegister(pMan,pcVar1);
    Vec_StrFree(p);
    return pcVar1;
  }
  __assert_fail("nValues > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcSop.c"
                ,0x475,"char *Abc_SopDecoderPos(Mem_Flex_t *, int)");
}

Assistant:

char * Abc_SopDecoderPos( Mem_Flex_t * pMan, int nValues )
{
    char * pResult;
    Vec_Str_t * vSop;
    int i, k;
    assert( nValues > 1 );
    vSop = Vec_StrAlloc( 100 );
    for ( i = 0; i < nValues; i++ )
    {
        for ( k = 0; k < nValues; k++ )
        {
            if ( k == i )
                Vec_StrPrintStr( vSop, "1 " );
            else
                Vec_StrPrintStr( vSop, "- " );
        }
        Vec_StrPrintNum( vSop, i );
        Vec_StrPush( vSop, '\n' );
    }
    Vec_StrPush( vSop, 0 );
    pResult = Abc_SopRegister( pMan, Vec_StrArray(vSop) );
    Vec_StrFree( vSop );
    return pResult;
}